

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderStorageBufferObjectTests.cpp
# Opt level: O2

string * __thiscall
gl4cts::(anonymous_namespace)::AdvancedUnsizedArrayLength2::BuildShader_abi_cxx11_
          (string *__return_storage_ptr__,void *this)

{
  char cVar1;
  char cVar2;
  char cVar3;
  char cVar4;
  char cVar5;
  char cVar6;
  int iVar7;
  ostream *poVar8;
  long lVar9;
  string expr;
  string lastelemexpr;
  string decl;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a68;
  string lo;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_988;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_968;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_948;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_928;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_908;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_888;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_868;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_848;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_828;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_808;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_788;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_768;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_748;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_728;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_708;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_688;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_668;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_648;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_628;
  string sd;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5c8;
  string l [4];
  string e [4] [7];
  ostringstream os;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&os);
  std::__cxx11::string::string<std::allocator<char>>((string *)e,"bvec3",(allocator<char> *)l);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(e[0] + 1),"vec4",(allocator<char> *)&sd);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(e[0] + 2),"ivec3",(allocator<char> *)&lo);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(e[0] + 3),"ivec3",(allocator<char> *)&decl);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(e[0] + 4),"uvec2",(allocator<char> *)&expr);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(e[0] + 5),"vec2",(allocator<char> *)&lastelemexpr);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(e[0] + 6),"uvec4",(allocator<char> *)&local_a68);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(e + 1),"mat2",(allocator<char> *)&local_628);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(e[1] + 1),"mat3",(allocator<char> *)&local_648);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(e[1] + 2),"mat4",(allocator<char> *)&local_668);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(e[1] + 3),"mat4",(allocator<char> *)&local_688);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(e[1] + 4),"mat2x3",(allocator<char> *)&local_6a8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(e[1] + 5),"mat3x2",(allocator<char> *)&local_6c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(e[1] + 6),"mat4x2",(allocator<char> *)&local_6e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(e + 2),"mat2",(allocator<char> *)&local_708);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(e[2] + 1),"mat3",(allocator<char> *)&local_728);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(e[2] + 2),"mat4",(allocator<char> *)&local_748);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(e[2] + 3),"mat4",(allocator<char> *)&local_768);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(e[2] + 4),"mat2x3",(allocator<char> *)&local_788);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(e[2] + 5),"mat3x2",(allocator<char> *)&local_7a8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(e[2] + 6),"mat4x2",(allocator<char> *)&local_7c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(e + 3),"S0",(allocator<char> *)&local_7e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(e[3] + 1),"S1",(allocator<char> *)&local_808);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(e[3] + 2),"S2",(allocator<char> *)&local_828);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(e[3] + 3),"S2",(allocator<char> *)&local_848);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(e[3] + 4),"S4",(allocator<char> *)&local_868);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(e[3] + 5),"S5",(allocator<char> *)&local_888);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(e[3] + 6),"S6",(allocator<char> *)&local_8a8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&sd,
             "\nstruct S0 {\n  float f;\n  int i;\n  uint ui;\n  bool b;\n};\nstruct S1 {\n  ivec3 iv;\n  bvec2 bv;\n  vec4 v;\n  uvec2 uv;\n};\nstruct S2 {\n  mat2x2 m22;\n  mat4x4 m44;\n  mat2x3 m23;\n  mat4x2 m42;\n  mat3x4 m34;\n};\nstruct S4 {\n  float f[1];\n  int i[2];\n  uint ui[3];\n  bool b[4];\n  ivec3 iv[5];\n  bvec2 bv[6];\n  vec4  v[7];\n  uvec2 uv[8];\n};\nstruct S5 {\n  S0 s0;\n  S1 s1;\n  S2 s2;\n};\nstruct S6 {\n  S4 s4[3];\n};"
             ,(allocator<char> *)l);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&lo,glcts::fixed_sample_locations_values + 1,(allocator<char> *)l);
  std::__cxx11::string::string<std::allocator<char>>((string *)l,"std140",(allocator<char> *)&decl);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(l + 1),"std430",(allocator<char> *)&expr);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(l + 2),"shared",(allocator<char> *)&lastelemexpr);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(l + 3),"packed",(allocator<char> *)&local_a68);
  std::__cxx11::string::append((string *)&lo);
  if (*(int *)((long)this + 0x54) == 2) {
    std::__cxx11::string::append((char *)&lo);
  }
  std::operator+(&local_5e8,&sd,"\nlayout(");
  std::operator+(&local_5c8,&local_5e8,&lo);
  std::operator+(&local_8a8,&local_5c8,") buffer;\nlayout(binding = 0) readonly buffer Input0 {");
  cVar1 = *(char *)((long)this + 0x5c);
  if (cVar1 == '\x01') {
    std::operator+(&local_8e8,"\n  ",e[*(int *)((long)this + 0x54)]);
    std::operator+(&local_8c8,&local_8e8," pad0;");
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_8c8,glcts::fixed_sample_locations_values + 1,
               (allocator<char> *)&local_8e8);
  }
  std::operator+(&local_888,&local_8a8,&local_8c8);
  std::operator+(&local_868,&local_888,"\n  ");
  std::operator+(&local_848,&local_868,e[*(int *)((long)this + 0x54)]);
  std::operator+(&local_828,&local_848,
                 " g_input0[];\n};\nlayout(binding = 1) readonly buffer Input1 {");
  cVar2 = *(char *)((long)this + 0x5c);
  if (cVar2 == '\x01') {
    std::operator+(&local_928,"\n  ",e[*(int *)((long)this + 0x54)] + 1);
    std::operator+(&local_908,&local_928," pad1;");
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_908,glcts::fixed_sample_locations_values + 1,
               (allocator<char> *)&local_928);
  }
  std::operator+(&local_808,&local_828,&local_908);
  std::operator+(&local_7e8,&local_808,"\n  ");
  std::operator+(&local_7c8,&local_7e8,e[*(int *)((long)this + 0x54)] + 1);
  std::operator+(&local_7a8,&local_7c8,
                 " data[];\n} g_input1;\nlayout(binding = 2) readonly buffer Input23 {");
  cVar3 = *(char *)((long)this + 0x5c);
  if (cVar3 == '\x01') {
    std::operator+(&local_968,"\n  ",e[*(int *)((long)this + 0x54)] + 2);
    std::operator+(&local_948,&local_968," pad2;");
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_948,glcts::fixed_sample_locations_values + 1,
               (allocator<char> *)&local_968);
  }
  std::operator+(&local_788,&local_7a8,&local_948);
  std::operator+(&local_768,&local_788,"\n  ");
  std::operator+(&local_748,&local_768,e[*(int *)((long)this + 0x54)] + 2);
  std::operator+(&local_728,&local_748,
                 " data[];\n} g_input23[2];\nlayout(binding = 4) buffer Output0 {");
  cVar4 = *(char *)((long)this + 0x5c);
  if (cVar4 == '\x01') {
    std::operator+(&local_9a8,"\n  ",e[*(int *)((long)this + 0x54)] + 4);
    std::operator+(&local_988,&local_9a8," pad4;");
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_988,glcts::fixed_sample_locations_values + 1,
               (allocator<char> *)&local_9a8);
  }
  std::operator+(&local_708,&local_728,&local_988);
  std::operator+(&local_6e8,&local_708,"\n  ");
  std::operator+(&local_6c8,&local_6e8,e[*(int *)((long)this + 0x54)] + 4);
  std::operator+(&local_6a8,&local_6c8,
                 " data[];\n} g_output0;\nlayout(binding = 5) readonly buffer Input4 {");
  cVar5 = *(char *)((long)this + 0x5c);
  if (cVar5 == '\x01') {
    std::operator+(&local_9e8,"\n  ",e[*(int *)((long)this + 0x54)] + 5);
    std::operator+(&local_9c8,&local_9e8," pad5;");
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_9c8,glcts::fixed_sample_locations_values + 1,
               (allocator<char> *)&local_9e8);
  }
  std::operator+(&local_688,&local_6a8,&local_9c8);
  std::operator+(&local_668,&local_688,"\n  ");
  std::operator+(&local_648,&local_668,e[*(int *)((long)this + 0x54)] + 5);
  std::operator+(&local_628,&local_648," data[];\n} g_input4;\nlayout(binding = 6) buffer Output1 {"
                );
  cVar6 = *(char *)((long)this + 0x5c);
  if (cVar6 == '\x01') {
    std::operator+(&local_a28,"\n  ",e[*(int *)((long)this + 0x54)] + 6);
    std::operator+(&local_a08,&local_a28," pad6;");
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a08,glcts::fixed_sample_locations_values + 1,
               (allocator<char> *)&local_a28);
  }
  std::operator+(&local_a68,&local_628,&local_a08);
  std::operator+(&lastelemexpr,&local_a68,"\n  ");
  std::operator+(&expr,&lastelemexpr,e[*(int *)((long)this + 0x54)] + 6);
  std::operator+(&decl,&expr,
                 " data[];\n} g_output1;\nlayout(std430, binding = 7) buffer Output {\n  int g_length[];\n};"
                );
  std::__cxx11::string::~string((string *)&expr);
  std::__cxx11::string::~string((string *)&lastelemexpr);
  std::__cxx11::string::~string((string *)&local_a68);
  std::__cxx11::string::~string((string *)&local_a08);
  if (cVar6 != '\0') {
    std::__cxx11::string::~string((string *)&local_a28);
  }
  std::__cxx11::string::~string((string *)&local_628);
  std::__cxx11::string::~string((string *)&local_648);
  std::__cxx11::string::~string((string *)&local_668);
  std::__cxx11::string::~string((string *)&local_688);
  std::__cxx11::string::~string((string *)&local_9c8);
  if (cVar5 != '\0') {
    std::__cxx11::string::~string((string *)&local_9e8);
  }
  std::__cxx11::string::~string((string *)&local_6a8);
  std::__cxx11::string::~string((string *)&local_6c8);
  std::__cxx11::string::~string((string *)&local_6e8);
  std::__cxx11::string::~string((string *)&local_708);
  std::__cxx11::string::~string((string *)&local_988);
  if (cVar4 != '\0') {
    std::__cxx11::string::~string((string *)&local_9a8);
  }
  std::__cxx11::string::~string((string *)&local_728);
  std::__cxx11::string::~string((string *)&local_748);
  std::__cxx11::string::~string((string *)&local_768);
  std::__cxx11::string::~string((string *)&local_788);
  std::__cxx11::string::~string((string *)&local_948);
  if (cVar3 != '\0') {
    std::__cxx11::string::~string((string *)&local_968);
  }
  std::__cxx11::string::~string((string *)&local_7a8);
  std::__cxx11::string::~string((string *)&local_7c8);
  std::__cxx11::string::~string((string *)&local_7e8);
  std::__cxx11::string::~string((string *)&local_808);
  std::__cxx11::string::~string((string *)&local_908);
  if (cVar2 != '\0') {
    std::__cxx11::string::~string((string *)&local_928);
  }
  std::__cxx11::string::~string((string *)&local_828);
  std::__cxx11::string::~string((string *)&local_848);
  std::__cxx11::string::~string((string *)&local_868);
  std::__cxx11::string::~string((string *)&local_888);
  std::__cxx11::string::~string((string *)&local_8c8);
  if (cVar1 != '\0') {
    std::__cxx11::string::~string((string *)&local_8e8);
  }
  std::__cxx11::string::~string((string *)&local_8a8);
  std::__cxx11::string::~string((string *)&local_5c8);
  std::__cxx11::string::~string((string *)&local_5e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&expr,
             "\n  g_length[0] = g_input0.length();\n  g_length[1] = g_input1.data.length();\n  g_length[2] = g_input23[0].data.length();\n  g_length[3] = g_input23[1].data.length();\n  g_length[4] = g_output0.data.length();\n  g_length[5] = g_input4.data.length();\n  g_length[6] = g_output1.data.length();"
             ,(allocator<char> *)&lastelemexpr);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&lastelemexpr,
             "\n  g_output0.data[g_output0.data.length()-2] += g_output0.data[g_output0.data.length()-1];\n  g_output1.data[g_output1.data.length()-2] += g_output1.data[g_output1.data.length()-1];"
             ,(allocator<char> *)&local_a68);
  if (*(char *)((long)this + 100) == '\x01') {
    std::__cxx11::string::append((string *)&expr);
  }
  iVar7 = *(int *)((long)this + 0x50);
  if (iVar7 == 0) {
    poVar8 = std::operator<<(&os.super_basic_ostream<char,_std::char_traits<char>_>,(string *)&decl)
    ;
    poVar8 = std::operator<<(poVar8,"\nvoid main() {\n  gl_Position = vec4(0,0,0,1);");
    std::operator<<(poVar8,(string *)&expr);
    iVar7 = *(int *)((long)this + 0x50);
  }
  if (iVar7 == 1) {
    poVar8 = std::operator<<(&os.super_basic_ostream<char,_std::char_traits<char>_>,
                             "\nlayout(location = 0) out vec4 o_color;");
    poVar8 = std::operator<<(poVar8,(string *)&decl);
    poVar8 = std::operator<<(poVar8,"\nvoid main() {\n  o_color = vec4(0.0, 1.0, 0.0, 1.0);");
    std::operator<<(poVar8,(string *)&expr);
    iVar7 = *(int *)((long)this + 0x50);
  }
  if (iVar7 == 2) {
    poVar8 = std::operator<<(&os.super_basic_ostream<char,_std::char_traits<char>_>,
                             "\nlayout(local_size_x = 1) in;");
    poVar8 = std::operator<<(poVar8,(string *)&decl);
    poVar8 = std::operator<<(poVar8,"\nvoid main() {");
    std::operator<<(poVar8,(string *)&expr);
  }
  std::operator<<(&os.super_basic_ostream<char,_std::char_traits<char>_>,"\n}");
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::~string((string *)&lastelemexpr);
  std::__cxx11::string::~string((string *)&expr);
  std::__cxx11::string::~string((string *)&decl);
  lVar9 = 0x60;
  do {
    std::__cxx11::string::~string((string *)((long)&l[0]._M_dataplus._M_p + lVar9));
    lVar9 = lVar9 + -0x20;
  } while (lVar9 != -0x20);
  std::__cxx11::string::~string((string *)&lo);
  std::__cxx11::string::~string((string *)&sd);
  lVar9 = 0x360;
  do {
    std::__cxx11::string::~string((string *)((long)&e[0][0]._M_dataplus._M_p + lVar9));
    lVar9 = lVar9 + -0x20;
  } while (lVar9 != -0x20);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&os);
  return __return_storage_ptr__;
}

Assistant:

std::string BuildShader()
	{
		std::ostringstream os;
		std::string		   e[4][7] = { { "bvec3", "vec4", "ivec3", "ivec3", "uvec2", "vec2", "uvec4" },
								{ "mat2", "mat3", "mat4", "mat4", "mat2x3", "mat3x2", "mat4x2" },
								{ "mat2", "mat3", "mat4", "mat4", "mat2x3", "mat3x2", "mat4x2" },
								{ "S0", "S1", "S2", "S2", "S4", "S5", "S6" } };

		std::string sd =
			NL "struct S0 {" NL "  float f;" NL "  int i;" NL "  uint ui;" NL "  bool b;" NL "};" NL "struct S1 {" NL
			   "  ivec3 iv;" NL "  bvec2 bv;" NL "  vec4 v;" NL "  uvec2 uv;" NL "};" NL "struct S2 {" NL
			   "  mat2x2 m22;" NL "  mat4x4 m44;" NL "  mat2x3 m23;" NL "  mat4x2 m42;" NL "  mat3x4 m34;" NL "};" NL
			   "struct S4 {" NL "  float f[1];" NL "  int i[2];" NL "  uint ui[3];" NL "  bool b[4];" NL
			   "  ivec3 iv[5];" NL "  bvec2 bv[6];" NL "  vec4  v[7];" NL "  uvec2 uv[8];" NL "};" NL "struct S5 {" NL
			   "  S0 s0;" NL "  S1 s1;" NL "  S2 s2;" NL "};" NL "struct S6 {" NL "  S4 s4[3];" NL "};";

		std::string lo   = "";
		std::string l[4] = { "std140", "std430", "shared", "packed" };
		lo += l[layout];

		if (etype == matrix_rm)
			lo += ", row_major";

		std::string decl = sd + NL "layout(" + lo + ") buffer;" NL "layout(binding = 0) readonly buffer Input0 {" +
						   ((other_members) ? ("\n  " + e[etype][0] + " pad0;") : "") + NL "  " + e[etype][0] +
						   " g_input0[];" NL "};" NL "layout(binding = 1) readonly buffer Input1 {" +
						   ((other_members) ? ("\n  " + e[etype][1] + " pad1;") : "") + NL "  " + e[etype][1] +
						   " data[];" NL "} g_input1;" NL "layout(binding = 2) readonly buffer Input23 {" +
						   ((other_members) ? ("\n  " + e[etype][2] + " pad2;") : "") + NL "  " + e[etype][2] +
						   " data[];" NL "} g_input23[2];" NL "layout(binding = 4) buffer Output0 {" +
						   ((other_members) ? ("\n  " + e[etype][4] + " pad4;") : "") + NL "  " + e[etype][4] +
						   " data[];" NL "} g_output0;" NL "layout(binding = 5) readonly buffer Input4 {" +
						   ((other_members) ? ("\n  " + e[etype][5] + " pad5;") : "") + NL "  " + e[etype][5] +
						   " data[];" NL "} g_input4;" NL "layout(binding = 6) buffer Output1 {" +
						   ((other_members) ? ("\n  " + e[etype][6] + " pad6;") : "") + NL "  " + e[etype][6] +
						   " data[];" NL "} g_output1;" NL "layout(std430, binding = 7) buffer Output {" NL
						   "  int g_length[];" NL "};";

		std::string expr =
			NL "  g_length[0] = g_input0.length();" NL "  g_length[1] = g_input1.data.length();" NL
			   "  g_length[2] = g_input23[0].data.length();" NL "  g_length[3] = g_input23[1].data.length();" NL
			   "  g_length[4] = g_output0.data.length();" NL "  g_length[5] = g_input4.data.length();" NL
			   "  g_length[6] = g_output1.data.length();";

		std::string lastelemexpr =
			NL "  g_output0.data[g_output0.data.length()-2] += g_output0.data[g_output0.data.length()-1];" NL
			   "  g_output1.data[g_output1.data.length()-2] += g_output1.data[g_output1.data.length()-1];";

		if (length_as_index)
			expr += lastelemexpr;
		if (stage == vertex)
		{
			os << decl << NL "void main() {" NL "  gl_Position = vec4(0,0,0,1);" << expr;
		}
		if (stage == fragment)
		{
			os << NL "layout(location = 0) out vec4 o_color;" << decl
			   << NL "void main() {" NL "  o_color = vec4(0.0, 1.0, 0.0, 1.0);" << expr;
		}
		if (stage == compute)
		{
			os << NL "layout(local_size_x = 1) in;" << decl << NL "void main() {" << expr;
		}
		os << NL "}";
		return os.str();
	}